

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::swap
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this,size_t _i0,size_t _i1)

{
  value_type_conflict1 vVar1;
  pointer pSVar2;
  
  pSVar2 = (this->data_).
           super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  vVar1 = pSVar2[_i0].status_;
  pSVar2[_i0].status_ = pSVar2[_i1].status_;
  pSVar2[_i1].status_ = vVar1;
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }